

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_case_expression.cpp
# Opt level: O3

bool __thiscall
duckdb::BoundCaseExpression::Equals(BoundCaseExpression *this,BaseExpression *other_p)

{
  pointer pBVar1;
  pointer pBVar2;
  bool bVar3;
  int iVar4;
  BoundCaseExpression *pBVar5;
  const_reference pvVar6;
  type pEVar7;
  type pEVar8;
  size_type __n;
  
  bVar3 = BaseExpression::Equals((BaseExpression *)this,other_p);
  if ((bVar3) &&
     (bVar3 = LogicalType::operator==
                        (&(this->super_Expression).return_type,(LogicalType *)(other_p + 1)), bVar3)
     ) {
    pBVar5 = BaseExpression::Cast<duckdb::BoundCaseExpression>(other_p);
    pBVar1 = (this->case_checks).
             super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
             super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->case_checks).
             super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
             super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)pBVar2 - (long)pBVar1 ==
        (long)(pBVar5->case_checks).
              super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
              super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(pBVar5->case_checks).
              super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
              super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      if (pBVar2 != pBVar1) {
        __n = 0;
        do {
          pvVar6 = vector<duckdb::BoundCaseCheck,_true>::operator[](&this->case_checks,__n);
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(&pvVar6->when_expr);
          pvVar6 = vector<duckdb::BoundCaseCheck,_true>::operator[](&pBVar5->case_checks,__n);
          pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(&pvVar6->when_expr);
          iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[10])(pEVar7,pEVar8);
          if ((char)iVar4 == '\0') {
            return false;
          }
          pvVar6 = vector<duckdb::BoundCaseCheck,_true>::operator[](&this->case_checks,__n);
          pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(&pvVar6->then_expr);
          pvVar6 = vector<duckdb::BoundCaseCheck,_true>::operator[](&pBVar5->case_checks,__n);
          pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(&pvVar6->then_expr);
          iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[10])(pEVar7,pEVar8);
          if ((char)iVar4 == '\0') {
            return false;
          }
          __n = __n + 1;
        } while (__n < (ulong)((long)(this->case_checks).
                                     super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                     .
                                     super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->case_checks).
                                     super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                     .
                                     super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this->else_expr);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&pBVar5->else_expr);
      iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[10])(pEVar7,pEVar8);
      return SUB41(iVar4,0);
    }
  }
  return false;
}

Assistant:

bool BoundCaseExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundCaseExpression>();
	if (case_checks.size() != other.case_checks.size()) {
		return false;
	}
	for (idx_t i = 0; i < case_checks.size(); i++) {
		if (!Expression::Equals(*case_checks[i].when_expr, *other.case_checks[i].when_expr)) {
			return false;
		}
		if (!Expression::Equals(*case_checks[i].then_expr, *other.case_checks[i].then_expr)) {
			return false;
		}
	}
	if (!Expression::Equals(*else_expr, *other.else_expr)) {
		return false;
	}
	return true;
}